

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O0

void LoadEXR_RGB(float **rgb,int *width,int *height,char *filename)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int *in_RCX;
  int *in_RDX;
  float **in_RSI;
  long *in_RDI;
  int i;
  float *rgba;
  int local_2c;
  char *in_stack_ffffffffffffffd8;
  
  LoadEXR_RGBA(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(*(int *)in_RSI * *in_RDX * 3);
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *in_RDI = (long)pvVar4;
  for (local_2c = 0; local_2c < *(int *)in_RSI * *in_RDX; local_2c = local_2c + 1) {
    lVar1 = *in_RDI;
    *(undefined8 *)(lVar1 + (long)(local_2c * 3) * 4) =
         *(undefined8 *)(in_stack_ffffffffffffffd8 + (long)(local_2c << 2) * 4);
    *(undefined4 *)(lVar1 + 8 + (long)(local_2c * 3) * 4) =
         *(undefined4 *)(in_stack_ffffffffffffffd8 + (long)(local_2c << 2) * 4 + 8);
  }
  free(in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void LoadEXR_RGB(float** rgb, int* width, int* height, const char* filename)
{
  float* rgba;
  LoadEXR_RGBA(&rgba, width, height, filename);
  *rgb = new float[(*width)*(*height)*3];
  for (int i=0; i<(*width)*(*height); ++i) {
    memcpy(*rgb + 3*i, rgba + 4*i, 3 * sizeof(float));
  }
  free(rgba);
}